

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Socket> * __thiscall asl::Array<asl::Socket>::resize(Array<asl::Socket> *this,int m)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  Socket *pSVar6;
  long lVar7;
  
  iVar2 = *(int *)&this->_a[-2].super_SmartObject._p;
  lVar7 = (long)iVar2;
  reserve(this,m);
  if (iVar2 < m) {
    pSVar6 = this->_a + lVar7;
    lVar7 = (long)m * 8 + lVar7 * -8;
    do {
      Socket::Socket(pSVar6);
      pSVar6 = pSVar6 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  else if (m < iVar2) {
    pSVar6 = this->_a;
    lVar5 = (long)m << 3;
    do {
      lVar3 = *(long *)((long)&(pSVar6->super_SmartObject)._p + lVar5);
      if (lVar3 != 0) {
        LOCK();
        piVar1 = (int *)(lVar3 + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (plVar4 = *(long **)((long)&(pSVar6->super_SmartObject)._p + lVar5),
           plVar4 != (long *)0x0)) {
          (**(code **)(*plVar4 + 8))();
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar7 * 8 != lVar5);
  }
  *(int *)&this->_a[-2].super_SmartObject._p = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}